

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateBuildingCode
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedImmutableEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if ($get_mutable_bit_builder$) {\n  $name$_ = java.util.Collections.unmodifiableList($name$_);\n  $clear_mutable_bit_builder$;\n}\nresult.$name$_ = $name$_;\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  // The code below ensures that the result has an immutable list. If our
  // list is immutable, we can just reuse it. If not, we make it immutable.
  printer->Print(variables_,
    "if ($get_mutable_bit_builder$) {\n"
    "  $name$_ = java.util.Collections.unmodifiableList($name$_);\n"
    "  $clear_mutable_bit_builder$;\n"
    "}\n"
    "result.$name$_ = $name$_;\n");
}